

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ransac.hpp
# Opt level: O0

bool __thiscall
opengv::sac::Ransac<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>::
computeModel(Ransac<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem> *this,
            int debug_verbosity_level)

{
  bool bVar1;
  uint uVar2;
  element_type *this_00;
  double *pdVar3;
  size_type sVar4;
  element_type *peVar5;
  int in_ESI;
  long in_RDI;
  double dVar6;
  pointer __x;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [16];
  double p_no_outliers;
  double w;
  uint max_skip;
  uint skipped_count;
  int n_inliers_count;
  model_t model_coefficients;
  vector<int,_std::allocator<int>_> selection;
  double k;
  int n_best_inliers_count;
  SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_fffffffffffffe80;
  FILE *__stream;
  Matrix<double,_3,_4,_0,_3,_4> *in_stack_fffffffffffffe88;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  double local_128;
  double local_120;
  double local_118;
  vector<int,_std::allocator<int>_> local_110;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> local_68;
  double local_50;
  uint local_48;
  int local_44;
  bool local_31;
  
  *(undefined4 *)(in_RDI + 0xc) = 0;
  local_48 = 0x80000001;
  local_50 = 1.0;
  local_44 = in_ESI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xbadccc);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0xbadcd9);
  local_f0 = 0;
  local_f4 = 0;
  local_f8 = *(int *)(in_RDI + 8) * 10;
  do {
    while( true ) {
      auVar7._0_8_ = (double)*(int *)(in_RDI + 0xc);
      auVar7._8_8_ = in_XMM0_Qb;
      in_XMM0_Qb = 0;
      if (local_50 <= auVar7._0_8_ || local_f8 <= local_f4) goto LAB_00bae09a;
      peVar5 = std::
               __shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xbadd53);
      (*(peVar5->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        _vptr_SampleConsensusProblem[2])(peVar5,in_RDI + 0xc,&local_68);
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffe98);
      if (bVar1) {
        fprintf(_stderr,"[sm::RandomSampleConsensus::computeModel] No samples could be selected!\n")
        ;
        goto LAB_00bae09a;
      }
      peVar5 = std::
               __shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xbaddd9);
      uVar2 = (*(peVar5->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                _vptr_SampleConsensusProblem[5])(peVar5,&local_68,&stack0xffffffffffffff20);
      if ((uVar2 & 1) != 0) break;
      local_f4 = local_f4 + 1;
    }
    peVar5 = std::
             __shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0xbade2c);
    in_XMM0_Qb = 0;
    local_f0 = (*(peVar5->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                 _vptr_SampleConsensusProblem[10])
                         (*(undefined8 *)(in_RDI + 0x10),peVar5,&stack0xffffffffffffff20);
    if ((int)local_48 < (int)local_f0) {
      local_48 = local_f0;
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=
                (in_stack_fffffffffffffe88,
                 (Matrix<double,_3,_4,_0,_3,_4> *)in_stack_fffffffffffffe80);
      dVar6 = (double)(int)local_48;
      std::
      __shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xbadecd);
      SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::getIndices
                (in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe98 = &local_110;
      this_00 = std::
                __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0xbadeeb);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(this_00);
      auVar7 = vcvtusi2sd_avx512f(auVar7,sVar4);
      __x = (pointer)(dVar6 / auVar7._0_8_);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
                ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)0xbadf13);
      local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = __x;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_68);
      auVar7 = vcvtusi2sd_avx512f(auVar7,sVar4);
      local_118 = pow((double)__x,auVar7._0_8_);
      local_118 = 1.0 - local_118;
      local_120 = std::numeric_limits<double>::epsilon();
      pdVar3 = std::max<double>(&local_120,&local_118);
      local_118 = *pdVar3;
      local_128 = std::numeric_limits<double>::epsilon();
      local_128 = 1.0 - local_128;
      pdVar3 = std::min<double>(&local_128,&local_118);
      local_118 = *pdVar3;
      in_stack_fffffffffffffe88 =
           (Matrix<double,_3,_4,_0,_3,_4> *)log(1.0 - *(double *)(in_RDI + 0x18));
      local_50 = log(local_118);
      local_50 = (double)in_stack_fffffffffffffe88 / local_50;
      in_XMM0_Qb = 0;
    }
    *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
    if (1 < local_44) {
      in_XMM0_Qb = 0;
      fprintf(_stdout,
              "[sm::RandomSampleConsensus::computeModel] Trial %d out of %f: %d inliers (best is: %d so far).\n"
              ,local_50,(ulong)*(uint *)(in_RDI + 0xc),(ulong)local_f0,(ulong)local_48);
    }
  } while (*(int *)(in_RDI + 0xc) <= *(int *)(in_RDI + 8));
  if (0 < local_44) {
    fprintf(_stdout,
            "[sm::RandomSampleConsensus::computeModel] RANSAC reached the maximum number of trials.\n"
           );
  }
LAB_00bae09a:
  if (0 < local_44) {
    __stream = _stdout;
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80));
    fprintf(__stream,"[sm::RandomSampleConsensus::computeModel] Model: %zu size, %d inliers.\n",
            sVar4,(ulong)local_48);
  }
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffe98);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xbae107);
  }
  else {
    peVar5 = std::
             __shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0xbae12a);
    (*(peVar5->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      _vptr_SampleConsensusProblem[9])
              (*(undefined8 *)(in_RDI + 0x10),peVar5,in_RDI + 0x20,in_RDI + 0x98);
  }
  local_31 = !bVar1;
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe98);
  return (bool)(local_31 & 1);
}

Assistant:

bool
opengv::sac::Ransac<PROBLEM_T>::computeModel(
    int debug_verbosity_level)
{
  typedef PROBLEM_T problem_t;
  typedef typename problem_t::model_t model_t;

  iterations_ = 0;
  int n_best_inliers_count = -INT_MAX;
  double k = 1.0;

  std::vector<int> selection;
  model_t model_coefficients;

  int n_inliers_count = 0;
  unsigned skipped_count = 0;
  // supress infinite loops by just allowing 10 x maximum allowed iterations for
  // invalid model parameters!
  const unsigned max_skip = max_iterations_ * 10;

  // Iterate
  while( iterations_ < k && skipped_count < max_skip )
  {
    // Get X samples which satisfy the model criteria
    sac_model_->getSamples( iterations_, selection );

    if(selection.empty()) 
    {
      fprintf(stderr,
          "[sm::RandomSampleConsensus::computeModel] No samples could be selected!\n");
      break;
    }

    // Search for inliers in the point cloud for the current plane model M
    if(!sac_model_->computeModelCoefficients( selection, model_coefficients ))
    {
      //++iterations_;
      ++ skipped_count;
      continue;
    }

    // Select the inliers that are within threshold_ from the model
    //sac_model_->selectWithinDistance( model_coefficients, threshold_, inliers );
    //if(inliers.empty() && k > 1.0)
    //  continue;

    n_inliers_count = sac_model_->countWithinDistance(
        model_coefficients, threshold_ );

    // Better match ?
    if(n_inliers_count > n_best_inliers_count)
    {
      n_best_inliers_count = n_inliers_count;

      // Save the current model/inlier/coefficients selection as being the best so far
      model_              = selection;
      model_coefficients_ = model_coefficients;

      // Compute the k parameter (k=log(z)/log(1-w^n))
      double w = static_cast<double> (n_best_inliers_count) /
          static_cast<double> (sac_model_->getIndices()->size());
      double p_no_outliers = 1.0 - pow(w, static_cast<double> (selection.size()));
      p_no_outliers =
          (std::max) (std::numeric_limits<double>::epsilon(), p_no_outliers);
          // Avoid division by -Inf
      p_no_outliers =
          (std::min) (1.0 - std::numeric_limits<double>::epsilon(), p_no_outliers);
          // Avoid division by 0.
      k = log(1.0 - probability_) / log(p_no_outliers);
    }

    ++iterations_;
    if(debug_verbosity_level > 1)
      fprintf(stdout,
          "[sm::RandomSampleConsensus::computeModel] Trial %d out of %f: %d inliers (best is: %d so far).\n",
          iterations_, k, n_inliers_count, n_best_inliers_count );
    if(iterations_ > max_iterations_)
    {
      if(debug_verbosity_level > 0)
        fprintf(stdout,
            "[sm::RandomSampleConsensus::computeModel] RANSAC reached the maximum number of trials.\n");
      break;
    }
  }

  if(debug_verbosity_level > 0)
    fprintf(stdout,
        "[sm::RandomSampleConsensus::computeModel] Model: %zu size, %d inliers.\n",
        model_.size(), n_best_inliers_count );

  if(model_.empty())
  {
    inliers_.clear();
    return (false);
  }

  // Get the set of inliers that correspond to the best model found so far
  sac_model_->selectWithinDistance( model_coefficients_, threshold_, inliers_ );

  return (true);
}